

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O0

Block * __thiscall wasm::ReReloop::makeCFGBlock(ReReloop *this)

{
  pointer this_00;
  pointer this_01;
  Block *CodeInit;
  Block *pBVar1;
  ReReloop *this_local;
  
  this_00 = std::unique_ptr<CFG::Relooper,_std::default_delete<CFG::Relooper>_>::operator->
                      (&this->relooper);
  this_01 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  CodeInit = Builder::makeBlock(this_01,(Expression *)0x0);
  pBVar1 = CFG::Relooper::AddBlock(this_00,(Expression *)CodeInit,(Expression *)0x0);
  return pBVar1;
}

Assistant:

CFG::Block* makeCFGBlock() {
    return relooper->AddBlock(builder->makeBlock());
  }